

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_random.c
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  uint64_t *buffer;
  uint64_t *buffer_00;
  
  buffer = (uint64_t *)calloc(100,8);
  buffer_00 = (uint64_t *)calloc(100,8);
  iVar1 = get_random_numbers(buffer,100,0xa9f5cabbbb3d891);
  if ((iVar1 == 0) && (iVar1 = get_random_numbers(buffer_00,100,0xa9f5cabbbb3d891), iVar1 == 0)) {
    iVar2 = bcmp(buffer,buffer_00,800);
    iVar1 = 0;
    if (iVar2 != 0) goto LAB_001011e9;
  }
  iVar1 = 1;
LAB_001011e9:
  free(buffer);
  free(buffer_00);
  return iVar1;
}

Assistant:

int main() {

    uint64_t q = 765432354334562449;
    size_t count = 100;
    uint64_t* b1 = calloc(count, sizeof(uint64_t));
    uint64_t* b2 = calloc(count, sizeof(uint64_t));

    // try to gather random data

    if(get_random_numbers(b1, count, q) != 0)
        goto error;

    if(get_random_numbers(b2, count, q) != 0)
        goto error;

    // ensure that the two calls haven't returned the same data

    if(memcmp(b1, b2, count*sizeof(uint64_t)) == 0)
        goto error;

    free(b1);
    free(b2);
    return 0;


    error:
        free(b1);
        free(b2);
        return 1;

}